

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O0

bool __thiscall sentencepiece::NBestSentencePieceText::IsInitialized(NBestSentencePieceText *this)

{
  bool bVar1;
  RepeatedPtrField<sentencepiece::SentencePieceText> *in_stack_ffffffffffffffe8;
  
  bVar1 = google::protobuf::internal::AllAreInitialized<sentencepiece::SentencePieceText>
                    (in_stack_ffffffffffffffe8);
  return bVar1;
}

Assistant:

bool NBestSentencePieceText::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(nbests_)) return false;
  return true;
}